

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O3

schar down_gate(xchar x,xchar y)

{
  char cVar1;
  boolean bVar2;
  xchar xVar3;
  trap *ptVar4;
  byte bVar5;
  
  gate_str = (char *)0x0;
  bVar2 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if ((bVar2 != '\0') && (bVar2 = ok_to_quest(), bVar2 == '\0')) {
    return -1;
  }
  cVar1 = (level->dnstair).sx;
  if ((cVar1 != x) || (xVar3 = y, (level->dnstair).sy != y)) {
    if (((level->sstairs).sx != x) || (((level->sstairs).sy != y || ((level->sstairs).up != '\0'))))
    {
      if (((level->dnladder).sx == x) && ((level->dnladder).sy == y)) {
        gate_str = "down the ladder";
        return '\x05';
      }
      ptVar4 = t_at(level,(int)x,(int)y);
      if (ptVar4 == (trap *)0x0) {
        return -1;
      }
      if ((ptVar4->field_0x8 & 0x20) == 0) {
        return -1;
      }
      bVar5 = ptVar4->field_0x8 & 0x1f;
      if (1 < (byte)(bVar5 - 0xd)) {
        return -1;
      }
      gate_str = "through the hole";
      if (bVar5 == 0xe) {
        gate_str = "through the trap door";
      }
      return '\0';
    }
    gate_str = "down the stairs";
    if (cVar1 != x) {
      return '\a';
    }
    xVar3 = (level->dnstair).sy;
  }
  gate_str = "down the stairs";
  return (xVar3 != y) << 2 | 3;
}

Assistant:

schar down_gate(xchar x, xchar y)
{
	struct trap *ttmp;

	gate_str = 0;
	/* this matches the player restriction in goto_level() */
	if (on_level(&u.uz, &qstart_level) && !ok_to_quest())
	    return MIGR_NOWHERE;

	if ((level->dnstair.sx == x && level->dnstair.sy == y) ||
	    (level->sstairs.sx == x && level->sstairs.sy == y && !level->sstairs.up)) {
	    gate_str = "down the stairs";
	    return (level->dnstair.sx == x && level->dnstair.sy == y) ?
		    MIGR_STAIRS_UP : MIGR_SSTAIRS;
	}
	if (level->dnladder.sx == x && level->dnladder.sy == y) {
	    gate_str = "down the ladder";
	    return MIGR_LADDER_UP;
	}

	if (((ttmp = t_at(level, x, y)) != 0 && ttmp->tseen) &&
		(ttmp->ttyp == TRAPDOOR || ttmp->ttyp == HOLE)) {
	    gate_str = (ttmp->ttyp == TRAPDOOR) ?
		    "through the trap door" : "through the hole";
	    return MIGR_RANDOM;
	}
	return MIGR_NOWHERE;
}